

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsplitstrcb(const_bstring str,const_bstring splitStr,int pos,_func_int_void_ptr_int_int *cb,
               void *parm)

{
  int iVar1;
  int local_40;
  int ret;
  int p;
  int i;
  void *parm_local;
  _func_int_void_ptr_int_int *cb_local;
  int pos_local;
  const_bstring splitStr_local;
  const_bstring str_local;
  
  if ((((cb == (_func_int_void_ptr_int_int *)0x0) || (str == (const_bstring)0x0)) || (pos < 0)) ||
     (((str->slen < pos || (splitStr == (const_bstring)0x0)) || (splitStr->slen < 0)))) {
    str_local._4_4_ = -1;
  }
  else {
    ret = pos;
    if (splitStr->slen == 0) {
      for (; ret < str->slen; ret = ret + 1) {
        iVar1 = (*cb)(parm,ret,1);
        if (iVar1 < 0) {
          return iVar1;
        }
      }
      str_local._4_4_ = 0;
    }
    else {
      local_40 = pos;
      if (splitStr->slen == 1) {
        str_local._4_4_ = bsplitcb(str,*splitStr->data,pos,cb,parm);
      }
      else {
        for (; ret <= str->slen - splitStr->slen; ret = ret + 1) {
          iVar1 = memcmp(splitStr->data,str->data + ret,(long)splitStr->slen);
          if (iVar1 == 0) {
            iVar1 = (*cb)(parm,local_40,ret - local_40);
            if (iVar1 < 0) {
              return iVar1;
            }
            local_40 = splitStr->slen + ret;
            ret = local_40;
          }
        }
        str_local._4_4_ = (*cb)(parm,local_40,str->slen - local_40);
        if (-1 < str_local._4_4_) {
          str_local._4_4_ = 0;
        }
      }
    }
  }
  return str_local._4_4_;
}

Assistant:

int bsplitstrcb (const_bstring str, const_bstring splitStr, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen
	 || splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (0 == splitStr->slen) {
		for (i=pos; i < str->slen; i++) {
			if ((ret = cb (parm, i, 1)) < 0) return ret;
		}
		return BSTR_OK;
	}

	if (splitStr->slen == 1)
		return bsplitcb (str, splitStr->data[0], pos, cb, parm);

	for (i=p=pos; i <= str->slen - splitStr->slen; i++) {
		if (0 == bstr__memcmp (splitStr->data, str->data + i,
		                       splitStr->slen)) {
			if ((ret = cb (parm, p, i - p)) < 0) return ret;
			i += splitStr->slen;
			p = i;
		}
	}
	if ((ret = cb (parm, p, str->slen - p)) < 0) return ret;
	return BSTR_OK;
}